

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Node::setError(Node *this,Twine *Msg,Token *Tok)

{
  Document::setError((this->Doc->_M_t).
                     super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                     .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl,Msg,Tok);
  return;
}

Assistant:

void Node::setError(const Twine &Msg, Token &Tok) const {
  Doc->setError(Msg, Tok);
}